

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O1

shared_ptr<ut::setup_impl<agge::WorkerTests>,_unsigned_int> __thiscall
ut::registry::get_setup<agge::WorkerTests>(registry *this)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  undefined8 extraout_RDX;
  uint *puVar3;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *extraout_RDX_03;
  uint *extraout_RDX_04;
  uint *extraout_RDX_05;
  long in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_bool>
  pVar4;
  shared_ptr<ut::setup_impl<agge::WorkerTests>,_unsigned_int> sVar5;
  string id;
  destructible *local_88;
  uint *local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>
  local_78;
  key_type local_48;
  
  agge::WorkerTests::__suite_id_abi_cxx11_();
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
                  *)(in_RSI + 0x48),&local_48);
  pVar4._8_8_ = extraout_RDX;
  pVar4.first._M_node = iVar2._M_node;
  if (iVar2._M_node == (_Base_ptr)(in_RSI + 0x50)) {
    local_88 = (destructible *)operator_new(0x38);
    local_88->_vptr_destructible = (_func_int **)&PTR__setup_impl_0010acf8;
    local_88[1]._vptr_destructible = (_func_int **)0x0;
    local_88[2]._vptr_destructible = (_func_int **)0x0;
    local_88[3]._vptr_destructible = (_func_int **)0x0;
    local_88[4]._vptr_destructible = (_func_int **)0x0;
    local_88[5]._vptr_destructible = (_func_int **)0x0;
    local_88[6]._vptr_destructible = (_func_int **)0x0;
    local_80 = (uint *)operator_new(4);
    *local_80 = 1;
    local_78.first._M_dataplus._M_p = (pointer)&local_78.first.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    if (local_80 != (uint *)0x0) {
      *local_80 = *local_80 + 1;
    }
    local_78.second._ptr = local_88;
    local_78.second._refcount = local_80;
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>>>>
            ::
            _M_emplace_unique<std::pair<std::__cxx11::string,ut::shared_ptr<ut::destructible,unsigned_int>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>>>>
                        *)(in_RSI + 0x48),&local_78);
  }
  puVar3 = pVar4._8_8_;
  if (iVar2._M_node == (_Base_ptr)(in_RSI + 0x50)) {
    if ((local_78.second._refcount != (uint *)0x0) &&
       (*local_78.second._refcount = *local_78.second._refcount - 1, *local_78.second._refcount == 0
       )) {
      if (local_78.second._ptr != (destructible *)0x0) {
        (*(local_78.second._ptr)->_vptr_destructible[1])();
        puVar3 = extraout_RDX_01;
      }
      if (local_78.second._refcount != (uint *)0x0) {
        operator_delete(local_78.second._refcount);
        puVar3 = extraout_RDX_02;
      }
    }
    local_78.second._ptr = (destructible *)0x0;
    local_78.second._refcount = (uint *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
      operator_delete(local_78.first._M_dataplus._M_p);
      puVar3 = extraout_RDX_03;
    }
    if ((local_80 != (uint *)0x0) && (*local_80 = *local_80 - 1, *local_80 == 0)) {
      if (local_88 != (destructible *)0x0) {
        (*local_88->_vptr_destructible[1])();
        puVar3 = extraout_RDX_04;
      }
      if (local_80 != (uint *)0x0) {
        operator_delete(local_80);
        puVar3 = extraout_RDX_05;
      }
    }
  }
  p_Var1 = pVar4.first._M_node._M_node[2]._M_parent;
  (this->_test_cases).
  super__Vector_base<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(pVar4.first._M_node._M_node + 2);
  (this->_test_cases).
  super__Vector_base<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var1->_M_color = p_Var1->_M_color + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
    puVar3 = extraout_RDX_00;
  }
  sVar5._refcount = puVar3;
  sVar5._ptr = (setup_impl<agge::WorkerTests> *)this;
  return sVar5;
}

Assistant:

inline shared_ptr< setup_impl< FixtureT > > registry::get_setup()
	{
		typedef setup_impl<FixtureT> fixture_setup;

		const std::string id = FixtureT::__suite_id();
		_setups_map_t::const_iterator s = _setups.find(id);

		s = s == _setups.end() ?
			_setups.insert(std::make_pair(id, shared_ptr<destructible>(new fixture_setup))).first : s;
		return shared_ptr<fixture_setup>(static_pointer_cast< fixture_setup >(s->second));
	}